

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O3

void * parseList(SymbolContext<char> *ctx)

{
  JSONValue *__args;
  _List_node_base *__position;
  undefined4 *puVar1;
  long lVar2;
  
  __position = (_List_node_base *)operator_new(0x18);
  __position->_M_prev = __position;
  __position->_M_next = __position;
  __position[1]._M_next = (_List_node_base *)0x0;
  if (0 < ctx->num_values) {
    lVar2 = 0;
    do {
      __args = (JSONValue *)ctx->values[lVar2];
      std::__cxx11::list<JSONValue,_std::allocator<JSONValue>_>::_M_insert<JSONValue>
                ((list<JSONValue,_std::allocator<JSONValue>_> *)__position,(iterator)__position,
                 __args);
      JSONValue::~JSONValue(__args);
      operator_delete(__args);
      lVar2 = lVar2 + 1;
    } while (lVar2 < ctx->num_values);
  }
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 4;
  *(_List_node_base **)(puVar1 + 2) = __position;
  return puVar1;
}

Assistant:

void *parseList(const SymbolContext<char>& ctx)
{
    JSONList *l = new JSONList();
    for (int i = 1; i <= ctx.count(); i++)
    {
        JSONValue *v = ctx.value<JSONValue>(i);
        l->emplace_back(std::move(*v));
        delete v;
    }
    return new JSONValue(l); 
}